

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O1

int write_s98v3_tags(s98c *ctx,FILE *fp)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (ctx->source_encoding != (char *)0x0) {
    iVar1 = write_s98v3_tags_utf8(ctx,fp);
    return iVar1;
  }
  if (ctx->tags_count != 0) {
    fwrite("[S98]",5,1,(FILE *)fp);
    if (ctx->tags_count != 0) {
      lVar2 = 8;
      uVar3 = 0;
      do {
        fprintf((FILE *)fp,"%s=%s\n",*(undefined8 *)((long)ctx->tags + lVar2 + -8),
                *(undefined8 *)((long)&ctx->tags->key + lVar2));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar3 < ctx->tags_count);
    }
    fputc(0,(FILE *)fp);
  }
  return 0;
}

Assistant:

int write_s98v3_tags(struct s98c* ctx, FILE* fp)
{
    int i;

#ifdef HAVE_ICONV
    if(ctx->source_encoding != NULL) return write_s98v3_tags_utf8(ctx, fp);
#endif

    if(ctx->tags_count == 0) return 0;

    fprintf(fp, "[S98]");
    for(i = 0; i < ctx->tags_count; i++) {
        struct s98taginfo* info = ctx->tags + i;
        fprintf(fp, "%s=%s\x0a", info->key, info->value);
    }
    fputc(0, fp);

    return 0;
}